

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_t::add_intvar
          (system_t *this,string *name,intvar_id_t size,integer_t min,integer_t max,
          integer_t initial,attributes_t *attributes)

{
  bool bVar1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  integer_t local_28;
  integer_t local_24;
  integer_t initial_local;
  integer_t max_local;
  integer_t min_local;
  intvar_id_t size_local;
  string *name_local;
  system_t *this_local;
  
  local_28 = initial;
  local_24 = max;
  initial_local = min;
  max_local = size;
  _min_local = name;
  name_local = (string *)this;
  bVar1 = has_variable(this,name);
  if (!bVar1) {
    intvars_t::add_intvar
              (&this->super_intvars_t,_min_local,max_local,initial_local,local_24,local_28,
               attributes);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,"Variable ",_min_local);
  std::operator+(&local_48,&local_68," is already declared");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void system_t::add_intvar(std::string const & name, tchecker::intvar_id_t size, tchecker::integer_t min,
                          tchecker::integer_t max, tchecker::integer_t initial,
                          tchecker::system::attributes_t const & attributes)
{
  if (has_variable(name))
    throw std::invalid_argument("Variable " + name + " is already declared");
  tchecker::system::intvars_t::add_intvar(name, size, min, max, initial, attributes);
}